

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O0

void Ivy_ObjDelete_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fFreeTop)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pObj_01;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *pFanin0;
  int fFreeTop_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x12e,"void Ivy_ObjDelete_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  iVar1 = Ivy_ObjIsNone(pObj);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsConst1(pObj);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsPi(pObj), iVar1 == 0)) {
      pObj_00 = Ivy_ObjFanin0(pObj);
      pObj_01 = Ivy_ObjFanin1(pObj);
      Ivy_ObjDelete(p,pObj,fFreeTop);
      if ((pObj_00 != (Ivy_Obj_t *)0x0) &&
         ((iVar1 = Ivy_ObjIsNone(pObj_00), iVar1 == 0 && (iVar1 = Ivy_ObjRefs(pObj_00), iVar1 == 0))
         )) {
        Ivy_ObjDelete_rec(p,pObj_00,1);
      }
      if (((pObj_01 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNone(pObj_01), iVar1 == 0)) &&
         (iVar1 = Ivy_ObjRefs(pObj_01), iVar1 == 0)) {
        Ivy_ObjDelete_rec(p,pObj_01,1);
      }
    }
    return;
  }
  __assert_fail("!Ivy_ObjIsNone(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                ,0x12f,"void Ivy_ObjDelete_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_ObjDelete_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fFreeTop )
{
    Ivy_Obj_t * pFanin0, * pFanin1;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_ObjIsNone(pObj) );
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsPi(pObj) )
        return;
    pFanin0 = Ivy_ObjFanin0(pObj);
    pFanin1 = Ivy_ObjFanin1(pObj);
    Ivy_ObjDelete( p, pObj, fFreeTop );
    if ( pFanin0 && !Ivy_ObjIsNone(pFanin0) && Ivy_ObjRefs(pFanin0) == 0 )
        Ivy_ObjDelete_rec( p, pFanin0, 1 );
    if ( pFanin1 && !Ivy_ObjIsNone(pFanin1) && Ivy_ObjRefs(pFanin1) == 0 )
        Ivy_ObjDelete_rec( p, pFanin1, 1 );
}